

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  uint i;
  ulong uVar1;
  pointer pvVar2;
  uint j;
  ulong uVar3;
  Matrix transposed;
  Matrix local_28;
  
  Matrix(&local_28,(this->m_shape).field_0.m_dims[1],(this->m_shape).field_0.m_dims[0]);
  for (uVar1 = 0; uVar1 < (this->m_shape).field_0.m_dims[1]; uVar1 = uVar1 + 1) {
    pvVar2 = (this->m_vals).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar3 = 0; uVar3 < (this->m_shape).field_0.m_dims[0]; uVar3 = uVar3 + 1) {
      local_28.m_vals.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = *(double *)
                 (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl +
                 uVar1 * 8);
      pvVar2 = pvVar2 + 1;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->m_vals,&local_28.m_vals);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28.m_vals);
  return this;
}

Assistant:

Matrix& Matrix::transpose(){
    Matrix transposed(m_shape.n_col, m_shape.n_row);
    // double tmp;

    for(uint i=0;i<m_shape.n_col;++i){
        for(uint j=0;j<m_shape.n_row;++j){
            // tmp=m_vals[i][j];
            transposed.m_vals[i][j]=m_vals[j][i];
        }
    }
    m_vals=transposed.m_vals;

    return *this;
}